

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode socket_recv(UA_Connection *connection,UA_ByteString *response,UA_UInt32 timeout)

{
  int iVar1;
  UA_Byte *__buf;
  size_t sVar2;
  int *piVar3;
  size_t __size;
  ulong local_38;
  timeval tmptv;
  
  __size = (size_t)(connection->localConf).recvBufferSize;
  __buf = (UA_Byte *)malloc(__size);
  response->data = __buf;
  if (__buf == (UA_Byte *)0x0) {
    response->length = 0;
    return 0x80030000;
  }
  if (timeout == 0) {
LAB_001296e3:
    sVar2 = recv(connection->sockfd,__buf,__size,0);
    if (sVar2 != 0) {
      if (-1 < (long)sVar2) {
        response->length = sVar2;
        return 0;
      }
      deleteMembers_noInit(response,UA_TYPES + 0xe);
      response->length = 0;
      response->data = (UA_Byte *)0x0;
      piVar3 = __errno_location();
      if ((timeout == 0) && (*piVar3 == 0xb)) {
        return 0;
      }
      goto LAB_00129717;
    }
  }
  else {
    local_38 = (ulong)(timeout * 1000) / 1000000;
    tmptv.tv_sec = (__time_t)((timeout * 1000) % 1000000);
    iVar1 = setsockopt(connection->sockfd,1,0x14,&local_38,0x10);
    if (iVar1 == 0) {
      __buf = response->data;
      __size = (size_t)(connection->localConf).recvBufferSize;
      goto LAB_001296e3;
    }
  }
  deleteMembers_noInit(response,UA_TYPES + 0xe);
  response->length = 0;
  response->data = (UA_Byte *)0x0;
LAB_00129717:
  connection->state = UA_CONNECTION_CLOSED;
  shutdown(connection->sockfd,2);
  close(connection->sockfd);
  return 0x80ae0000;
}

Assistant:

static UA_StatusCode
socket_recv(UA_Connection *connection, UA_ByteString *response, UA_UInt32 timeout) {
    response->data = malloc(connection->localConf.recvBufferSize);
    if(!response->data) {
        response->length = 0;
        return UA_STATUSCODE_BADOUTOFMEMORY; /* not enough memory retry */
    }

    if(timeout > 0) {
        /* currently, only the client uses timeouts */
#ifndef _WIN32
        UA_UInt32 timeout_usec = timeout * 1000;
# ifdef __APPLE__
        struct timeval tmptv = {(long int)(timeout_usec / 1000000), timeout_usec % 1000000};
# else
        struct timeval tmptv = {(long int)(timeout_usec / 1000000), (long int)(timeout_usec % 1000000)};
# endif
        int ret = setsockopt(connection->sockfd, SOL_SOCKET, SO_RCVTIMEO,
                             (const char *)&tmptv, sizeof(struct timeval));
#else
        DWORD timeout_dw = timeout;
        int ret = setsockopt(connection->sockfd, SOL_SOCKET, SO_RCVTIMEO,
                             (const char*)&timeout_dw, sizeof(DWORD));
#endif
        if(0 != ret) {
            UA_ByteString_deleteMembers(response);
            socket_close(connection);
            return UA_STATUSCODE_BADCONNECTIONCLOSED;
        }
    }

#ifdef __CYGWIN__
    /* Workaround for https://cygwin.com/ml/cygwin/2013-07/msg00107.html */
    ssize_t ret;
    if(timeout > 0) {
        fd_set fdset;
        FD_ZERO(&fdset);
        UA_fd_set(connection->sockfd, &fdset);
        UA_UInt32 timeout_usec = timeout * 1000;
        struct timeval tmptv = {(long int)(timeout_usec / 1000000),
                                (long int)(timeout_usec % 1000000)};
        int retval = select(connection->sockfd+1, &fdset, NULL, NULL, &tmptv);
        if(retval && UA_fd_isset(connection->sockfd, &fdset)) {
            ret = recv(connection->sockfd, (char*)response->data,
                       connection->localConf.recvBufferSize, 0);
        } else {
            ret = 0;
        }
    } else {
        ret = recv(connection->sockfd, (char*)response->data,
                   connection->localConf.recvBufferSize, 0);
    }
#else
    ssize_t ret = recv(connection->sockfd, (char*)response->data,
                       connection->localConf.recvBufferSize, 0);
#endif

    /* server has closed the connection */
    if(ret == 0) {
        UA_ByteString_deleteMembers(response);
        socket_close(connection);
        return UA_STATUSCODE_BADCONNECTIONCLOSED;
    }

    /* error case */
    if(ret < 0) {
        UA_ByteString_deleteMembers(response);
        if(errno__ == INTERRUPTED || (timeout > 0) ?
           false : (errno__ == EAGAIN || errno__ == WOULDBLOCK))
            return UA_STATUSCODE_GOOD; /* statuscode_good but no data -> retry */
        socket_close(connection);
        return UA_STATUSCODE_BADCONNECTIONCLOSED;
    }
    
    /* default case */
    response->length = (size_t)ret;
    return UA_STATUSCODE_GOOD;
}